

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_test_result.hpp
# Opt level: O2

void __thiscall
hayai::TestResult::TestResult
          (TestResult *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *runTimes,
          size_t iterations)

{
  ulong *puVar1;
  unsigned_long uVar2;
  pointer puVar3;
  ulong *puVar4;
  pointer puVar5;
  ulong uVar6;
  pointer puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint64_t uVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sortedRunTimes;
  
  inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_runTimes,runTimes);
  this->_iterations = iterations;
  this->_timeTotal = 0;
  this->_timeRunMin = 0xffffffffffffffff;
  this->_timeQuartile3 = 0.0;
  this->_timeRunMax = 0;
  this->_timeStdDev = 0.0;
  this->_timeMedian = 0.0;
  this->_timeQuartile1 = 0.0;
  puVar3 = (this->_runTimes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->_runTimes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar8 = 0xffffffffffffffff;
  uVar10 = 0;
  uVar11 = 0;
  for (lVar9 = 0; puVar1 = (ulong *)((long)puVar3 + lVar9), puVar1 != puVar4; lVar9 = lVar9 + 8) {
    uVar6 = *puVar1;
    uVar11 = uVar11 + uVar6;
    this->_timeTotal = uVar11;
    if (lVar9 == 0) {
      this->_timeRunMax = uVar6;
      uVar10 = uVar6;
LAB_001303c3:
      this->_timeRunMin = uVar6;
      uVar8 = uVar6;
    }
    else {
      if (uVar10 < uVar6) {
        this->_timeRunMax = uVar6;
        uVar10 = uVar6;
      }
      if (uVar6 < uVar8) goto LAB_001303c3;
    }
  }
  dVar12 = RunTimeAverage(this);
  puVar5 = (this->_runTimes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  dVar13 = 0.0;
  puVar3 = (this->_runTimes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (puVar7 = puVar3; puVar7 != puVar5; puVar7 = puVar7 + 1) {
    uVar2 = *puVar7;
    auVar17._8_4_ = (int)(uVar2 >> 0x20);
    auVar17._0_8_ = uVar2;
    auVar17._12_4_ = 0x45300000;
    dVar18 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) - dVar12;
    dVar13 = dVar13 + dVar18 * dVar18;
  }
  lVar9 = ((long)puVar5 - (long)puVar3 >> 3) + -1;
  auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar14._0_8_ = lVar9;
  auVar14._12_4_ = 0x45300000;
  dVar13 = dVar13 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  this->_timeStdDev = dVar13;
  inja::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&sortedRunTimes,&this->_runTimes);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (sortedRunTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start,
             sortedRunTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  uVar10 = (long)sortedRunTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)sortedRunTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)uVar10 >> 3;
  if (uVar8 < 2) {
    if (uVar10 != 8) goto LAB_0013061d;
    auVar15._0_8_ =
         (double)CONCAT44(0x43300000,
                          (int)*sortedRunTimes.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    auVar15._8_4_ =
         (int)(*sortedRunTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 0x20);
    auVar15._12_4_ = 0x45300000;
    dVar13 = auVar15._8_8_ - 1.9342813113834067e+25;
    dVar12 = dVar13 + (auVar15._0_8_ - 4503599627370496.0);
    dVar13 = dVar13 + (auVar15._0_8_ - 4503599627370496.0);
  }
  else {
    uVar6 = uVar8 >> 2;
    puVar4 = (ulong *)((long)sortedRunTimes.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                      (uVar8 & 0xfffffffffffffffe) * 4);
    if ((uVar10 & 8) == 0) {
      dVar18 = (((double)(*puVar4 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                (double)(*puVar4 & 0xffffffff | 0x4330000000000000) +
               ((double)(puVar4[-1] >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(puVar4[-1] & 0xffffffff | 0x4330000000000000)) * 0.5;
      dVar12 = ((double)(sortedRunTimes.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6] >> 0x20 | 0x4530000000000000) -
               1.9342813118337666e+25) +
               (double)(sortedRunTimes.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6] & 0xffffffff | 0x4330000000000000);
      dVar13 = ((double)(puVar4[uVar6] >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(puVar4[uVar6] & 0xffffffff | 0x4330000000000000);
    }
    else {
      auVar16._0_8_ = (double)CONCAT44(0x43300000,(int)*puVar4);
      auVar16._8_4_ = (int)(*puVar4 >> 0x20);
      auVar16._12_4_ = 0x45300000;
      dVar18 = (auVar16._8_8_ - 1.9342813113834067e+25) + (auVar16._0_8_ - 4503599627370496.0);
      dVar12 = (((double)(sortedRunTimes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6] >> 0x20 | 0x4530000000000000) -
                1.9342813118337666e+25) +
                (double)(sortedRunTimes.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar6] & 0xffffffff | 0x4330000000000000)
               + ((double)(sortedRunTimes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar6 - 1] >> 0x20 | 0x4530000000000000
                          ) - 1.9342813118337666e+25) +
                 (double)(sortedRunTimes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6 - 1] & 0xffffffff |
                         0x4330000000000000)) * 0.5;
      dVar13 = (((double)(puVar4[uVar6] >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                (double)(puVar4[uVar6] & 0xffffffff | 0x4330000000000000) +
               ((double)(puVar4[uVar6 - 1] >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
               (double)(puVar4[uVar6 - 1] & 0xffffffff | 0x4330000000000000)) * 0.5;
    }
    this->_timeMedian = dVar18;
  }
  this->_timeQuartile1 = dVar12;
  this->_timeQuartile3 = dVar13;
LAB_0013061d:
  inja::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&sortedRunTimes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

TestResult(const std::vector<uint64_t>& runTimes,
                   std::size_t iterations)
            :   _runTimes(runTimes),
                _iterations(iterations),
                _timeTotal(0),
                _timeRunMin(std::numeric_limits<uint64_t>::max()),
                _timeRunMax(std::numeric_limits<uint64_t>::min()),
                _timeStdDev(0.0),
                _timeMedian(0.0),
                _timeQuartile1(0.0),
                _timeQuartile3(0.0)
        {
            // Summarize under the assumption of values being accessed more
            // than once.
            std::vector<uint64_t>::iterator runIt = _runTimes.begin();

            while (runIt != _runTimes.end())
            {
                const uint64_t run = *runIt;

                _timeTotal += run;
                if ((runIt == _runTimes.begin()) || (run > _timeRunMax))
                    _timeRunMax = run;
                if ((runIt == _runTimes.begin()) || (run < _timeRunMin))
                    _timeRunMin = run;

                ++runIt;
            }

            // Calculate standard deviation.
            const double mean = RunTimeAverage();
            double accu = 0.0;

            runIt = _runTimes.begin();

            while (runIt != _runTimes.end())
            {
                const uint64_t run = *runIt;
                const double diff = double(run) - mean;
                accu += (diff * diff);

                ++runIt;
            }

            _timeStdDev = std::sqrt(accu / (_runTimes.size() - 1));

            // Calculate quartiles.
            std::vector<uint64_t> sortedRunTimes(_runTimes);
            std::sort(sortedRunTimes.begin(), sortedRunTimes.end());

            const std::size_t sortedSize = sortedRunTimes.size();
            const std::size_t sortedSizeHalf = sortedSize / 2;

            if (sortedSize >= 2)
            {
                const std::size_t quartile = sortedSizeHalf / 2;

                if ((sortedSize % 2) == 0)
                {
                    _timeMedian =
                        (double(sortedRunTimes[sortedSizeHalf - 1]) +
                         double(sortedRunTimes[sortedSizeHalf])) / 2;

                    _timeQuartile1 =
                        double(sortedRunTimes[quartile]);
                    _timeQuartile3 =
                        double(sortedRunTimes[sortedSizeHalf + quartile]);
                }
                else
                {
                    _timeMedian = double(sortedRunTimes[sortedSizeHalf]);

                    _timeQuartile1 =
                        (double(sortedRunTimes[quartile - 1]) +
                         double(sortedRunTimes[quartile])) / 2;
                    _timeQuartile3 = (
                        double(
                            sortedRunTimes[sortedSizeHalf + (quartile - 1)]
                        ) +
                        double(
                            sortedRunTimes[sortedSizeHalf + quartile]
                        )
                    ) / 2;
                }
            }
            else if (sortedSize > 0)
            {
                _timeQuartile1 = double(sortedRunTimes[0]);
                _timeQuartile3 = _timeQuartile1;
            }
        }